

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_acbp_v1.cpp
# Opt level: O0

void __thiscall intel_acbp_v1_t::pmda_entry_v2_t::_read(pmda_entry_v2_t *this)

{
  uint32_t uVar1;
  hash_t *this_00;
  unique_ptr<intel_acbp_v1_t::hash_t,_std::default_delete<intel_acbp_v1_t::hash_t>_> local_18;
  pmda_entry_v2_t *local_10;
  pmda_entry_v2_t *this_local;
  
  local_10 = this;
  uVar1 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
  this->m_base = uVar1;
  uVar1 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
  this->m_size = uVar1;
  this_00 = (hash_t *)operator_new(0x48);
  hash_t::hash_t(this_00,(this->super_kstruct).m__io,&this->super_kstruct,this->m__root);
  std::unique_ptr<intel_acbp_v1_t::hash_t,std::default_delete<intel_acbp_v1_t::hash_t>>::
  unique_ptr<std::default_delete<intel_acbp_v1_t::hash_t>,void>
            ((unique_ptr<intel_acbp_v1_t::hash_t,std::default_delete<intel_acbp_v1_t::hash_t>> *)
             &local_18,this_00);
  std::unique_ptr<intel_acbp_v1_t::hash_t,_std::default_delete<intel_acbp_v1_t::hash_t>_>::operator=
            (&this->m_hash,&local_18);
  std::unique_ptr<intel_acbp_v1_t::hash_t,_std::default_delete<intel_acbp_v1_t::hash_t>_>::
  ~unique_ptr(&local_18);
  return;
}

Assistant:

void intel_acbp_v1_t::pmda_entry_v2_t::_read() {
    m_base = m__io->read_u4le();
    m_size = m__io->read_u4le();
    m_hash = std::unique_ptr<hash_t>(new hash_t(m__io, this, m__root));
}